

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DualStringMappedVector.hpp
# Opt level: O2

__normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
 __thiscall
gmlc::containers::
DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>::
find(DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
     *this,GlobalBrokerId *searchValue)

{
  iterator iVar1;
  __normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
  _Var2;
  
  iVar1 = CLI::std::
          _Hashtable<helics::GlobalBrokerId,_std::pair<const_helics::GlobalBrokerId,_unsigned_long>,_std::allocator<std::pair<const_helics::GlobalBrokerId,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalBrokerId>,_std::hash<helics::GlobalBrokerId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->lookup2)._M_h,searchValue);
  if (iVar1.super__Node_iterator_base<std::pair<const_helics::GlobalBrokerId,_unsigned_long>,_false>
      ._M_cur == (__node_type *)0x0) {
    _Var2._M_current =
         (this->dataStorage).
         super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>.
         _M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    _Var2._M_current =
         (this->dataStorage).
         super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>.
         _M_impl.super__Vector_impl_data._M_start +
         *(long *)((long)iVar1.
                         super__Node_iterator_base<std::pair<const_helics::GlobalBrokerId,_unsigned_long>,_false>
                         ._M_cur + 0x10);
  }
  return (__normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
          )_Var2._M_current;
}

Assistant:

auto find(const searchType2& searchValue)
        {
            auto fnd = lookup2.find(searchValue);
            if (fnd != lookup2.end()) {
                return dataStorage.begin() + fnd->second;
            }
            return dataStorage.end();
        }